

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O3

void __thiscall http::Page::Page(Page *this)

{
  *(undefined **)this = &__cxxabiv1::__class_type_info::vtable;
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined8 *)&this->field_0x10 = 0;
  *(undefined8 *)&this->field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  std::locale::locale((locale *)&this->field_0x38);
  *(undefined ***)this = &PTR__Page_00110c78;
  this->TagDepth = 0;
  this->StartTagOpen = false;
  osThread::osThread(&this->Thread);
  std::ostream::ostream(&this->m_ostream,&this->super_streambuf);
  std::istream::istream((istream *)&this->m_istream,&this->super_streambuf);
  this->m_put_back = 5;
  (this->m_char_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_char_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_char_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

http::Page::Page()
    : TagDepth(0)
    , StartTagOpen(false)
    , m_ostream(this)
    , m_istream(this)
    , m_put_back(5)
{
}